

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O0

void __thiscall flatbuffers::ParserState::ParserState(ParserState *this)

{
  ParserState *this_local;
  
  this->prev_cursor_ = (char *)0x0;
  this->cursor_ = (char *)0x0;
  this->line_start_ = (char *)0x0;
  this->line_ = 0;
  this->token_ = -1;
  this->attr_is_trivial_ascii_string_ = true;
  std::__cxx11::string::string((string *)&this->attribute_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->doc_comment_);
  return;
}

Assistant:

ParserState()
      : prev_cursor_(nullptr),
        cursor_(nullptr),
        line_start_(nullptr),
        line_(0),
        token_(-1),
        attr_is_trivial_ascii_string_(true) {}